

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O2

yoml_t * resolve_tag(char *tag,yoml_t *node,void *cb_arg)

{
  undefined8 *puVar1;
  char *s;
  long lVar2;
  int iVar3;
  size_t in_RCX;
  long lVar4;
  long lVar5;
  h2o_iovec_t hVar6;
  yoml_parse_args_t local_50;
  
  iVar3 = strcmp(tag,"!file");
  if (iVar3 == 0) {
    if (node->type != YOML_TYPE_SCALAR) {
      fwrite("value of the !file node must be a scalar",0x28,1,_stderr);
      return (yoml_t *)0x0;
    }
    s = (node->data).scalar;
    lVar4 = *(long *)((long)cb_arg + 8) + 1;
    lVar5 = 0;
    do {
      lVar4 = lVar4 + -1;
      if (lVar4 == 0) {
        local_50.mem_set = (_func_void_ptr_void_ptr_int_size_t *)0x0;
        local_50.resolve_tag.cb = resolve_tag;
        local_50.filename = s;
        local_50.resolve_tag.cb_arg = cb_arg;
        node = load_config(&local_50,node);
        if (node == (yoml_t *)0x0) {
          return (yoml_t *)0x0;
        }
        h2o_vector__reserve((h2o_mem_pool_t *)cb_arg,(h2o_vector_t *)0x18,
                            *(long *)((long)cb_arg + 8) + 1,in_RCX);
        hVar6 = h2o_strdup((h2o_mem_pool_t *)0x0,s,0xffffffffffffffff);
        lVar4 = *cb_arg;
        lVar5 = *(long *)((long)cb_arg + 8);
        *(long *)((long)cb_arg + 8) = lVar5 + 1;
        lVar5 = lVar5 * 0x18;
        *(char **)(lVar4 + lVar5) = hVar6.base;
        *(size_t *)(lVar4 + 8 + lVar5) = hVar6.len;
        *(yoml_t **)(lVar4 + 0x10 + lVar5) = node;
        goto LAB_00184f9d;
      }
      lVar2 = *cb_arg;
      puVar1 = (undefined8 *)(lVar2 + lVar5);
      lVar5 = lVar5 + 0x18;
      iVar3 = strcmp(s,(char *)*puVar1);
    } while (iVar3 != 0);
    node = *(yoml_t **)(lVar2 + -8 + lVar5);
  }
LAB_00184f9d:
  node->_refcnt = node->_refcnt + 1;
  return node;
}

Assistant:

static yoml_t *resolve_tag(const char *tag, yoml_t *node, void *cb_arg)
{
    resolve_tag_arg_t *arg = (resolve_tag_arg_t *)cb_arg;

    if (strcmp(tag, "!file") == 0) {
        return resolve_file_tag(node, arg);
    }

    /* otherwise, return the node itself */
    ++node->_refcnt;
    return node;
}